

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double chi_square_noncentral_sample(double a,double b,int *seed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = chi_square_sample(a + -1.0,seed);
  if (b < 0.0) {
    dVar2 = sqrt(b);
  }
  else {
    dVar2 = SQRT(b);
  }
  dVar3 = normal_01_sample(seed);
  return (dVar3 + dVar2) * (dVar3 + dVar2) + dVar1;
}

Assistant:

double chi_square_noncentral_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_NONCENTRAL_SAMPLE samples the noncentral Chi squared PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 November 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the parameter of the PDF.
//    1.0 <= A.
//
//    Input, double B, the noncentrality parameter of the PDF.
//    0.0 <= B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CHI_SQUARE_NONCENTRAL_SAMPLE, a sample of the PDF.
//
{
  double a1;
  double a2;
  double b2;
  double x;
  double x1;
  double x2;

  a1 = a - 1.0;

  x1 = chi_square_sample ( a1, seed );

  a2 = sqrt ( b );
  b2 = 1.0;
  x2 = normal_sample ( a2, b2, seed );

  x = x1 + x2 * x2;

  return x;
}